

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  float *pfVar1;
  undefined8 *puVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiPtrOrIndex *pIVar5;
  ImGuiTableColumn *pIVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  ImU32 IVar11;
  ImPoolIdx IVar12;
  ImGuiTable *p;
  char *pcVar13;
  ImGuiPtrOrIndex *__dest;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  ImRect *pIVar18;
  byte bVar19;
  long lVar20;
  char *pcVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  ImGuiTableColumn *pIVar26;
  int iVar27;
  long lVar28;
  ImGuiContext *g;
  uint uVar29;
  ImVec2 IVar30;
  float fVar31;
  undefined1 in_register_00001204 [12];
  undefined8 extraout_XMM0_Qb;
  ImVec2 IVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  ImSpanAllocator<3> span_allocator;
  ImRect outer_rect;
  ImVec2 local_98;
  int iStack_90;
  int iStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined2 local_78;
  undefined4 uStack_76;
  undefined2 uStack_72;
  undefined1 uStack_70;
  uint local_6c;
  undefined1 local_68 [16];
  ImRect local_50;
  char *local_40;
  ImPool<ImGuiTable> *local_38;
  
  pIVar9 = GImGui;
  local_68._4_12_ = in_register_00001204;
  local_68._0_4_ = inner_width;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if (pIVar3->SkipItems == false) {
    if (0x3f < columns_count - 1U) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1f3d,"BeginTableEx","ImGui ASSERT FAILED: %s",
                  "columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && \"Only 1..64 columns allowed!\""
                 );
    }
    if ((((uint)flags >> 0x14 & 1) != 0) && (local_68._0_4_ < 0.0)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,7999,"BeginTableEx","ImGui ASSERT FAILED: %s","inner_width >= 0.0f");
    }
    IVar30 = GetContentRegionAvail();
    fVar35 = IVar30.y;
    auVar34._8_4_ = (int)extraout_XMM0_Qb;
    auVar34._0_4_ = IVar30.x;
    auVar34._4_4_ = IVar30.y;
    auVar34._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
    if (IVar30.x <= 1.0) {
      auVar34._0_4_ = 0x3f800000;
    }
    if ((flags & 0x300000U) == 0) {
      IVar30 = CalcItemSize(*outer_size,auVar34._0_4_,0.0);
      local_50.Min = (pIVar3->DC).CursorPos;
      local_50.Max.x = IVar30.x + local_50.Min.x;
      local_50.Max.y = IVar30.y + local_50.Min.y;
    }
    else {
      if (fVar35 <= 1.0) {
        fVar35 = 1.0;
      }
      IVar30 = CalcItemSize(*outer_size,auVar34._0_4_,fVar35);
      local_50.Min = (pIVar3->DC).CursorPos;
      local_50.Max.x = IVar30.x + local_50.Min.x;
      local_50.Max.y = IVar30.y + local_50.Min.y;
      bVar10 = IsClippedEx(&local_50,0,false);
      if (bVar10) {
        ItemSize(&local_50,-1.0);
        goto LAB_001ee614;
      }
    }
    uVar23 = 0;
    uVar29 = (uint)(((uint)flags >> 0x14 & 1) == 0) * 0x8000 + 0x8000;
    if ((flags & 0x18000U) != 0) {
      uVar29 = uVar23;
    }
    uVar16 = (uint)flags >> 1 & 8 | uVar29 | flags;
    uVar29 = uVar16 | 0x20;
    if ((uVar16 & 0xf) != 0) {
      uVar29 = uVar16;
    }
    uVar16 = uVar29 & 0xfcefffff;
    if ((uVar29 >> 0x14 & 1) != 0) {
      uVar16 = uVar29;
    }
    uVar8 = uVar16 & 0xff1fffff;
    if ((uVar16 >> 0x15 & 1) != 0) {
      uVar8 = uVar16;
    }
    uVar16 = uVar8 & 0xfffbffff;
    if ((uVar8 & 0x300000) == 0) {
      uVar16 = uVar8;
    }
    uVar8 = uVar16 & 0xffffbfff;
    if ((uVar16 & 0x3000000) == 0) {
      uVar8 = uVar16;
    }
    uVar16 = pIVar3->Flags;
    local_38 = &pIVar9->Tables;
    local_40 = name;
    p = ImPool<ImGuiTable>::GetOrAddByKey(local_38,id);
    if (p->LastFrameActive == pIVar9->FrameCount) {
      uVar23 = (int)p->InstanceCurrent + 1;
    }
    local_6c = p->Flags;
    if ((0 < (int)uVar23) && (p->ColumnsCount != columns_count)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1f57,"BeginTableEx","ImGui ASSERT FAILED: %s",
                  "table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                 );
    }
    p->ID = id;
    p->Flags = uVar16 >> 3 & 0x20 | (uVar29 & 1) << 9 | uVar8;
    p->InstanceCurrent = (ImS16)uVar23;
    p->LastFrameActive = pIVar9->FrameCount;
    p->InnerWindow = pIVar3;
    p->OuterWindow = pIVar3;
    p->ColumnsCount = columns_count;
    iVar24 = (p->ColumnsNames).Buf.Capacity;
    fVar35 = (float)local_68._0_4_;
    if (iVar24 < 0) {
      uVar16 = iVar24 / 2 + iVar24;
      uVar29 = 0;
      if (0 < (int)uVar16) {
        uVar29 = uVar16;
      }
      pcVar13 = (char *)MemAlloc((ulong)uVar29);
      pcVar21 = (p->ColumnsNames).Buf.Data;
      if (pcVar21 != (char *)0x0) {
        memcpy(pcVar13,pcVar21,(long)(p->ColumnsNames).Buf.Size);
        MemFree((p->ColumnsNames).Buf.Data);
      }
      (p->ColumnsNames).Buf.Data = pcVar13;
      (p->ColumnsNames).Buf.Capacity = uVar29;
      fVar35 = (float)local_68._0_4_;
    }
    (p->ColumnsNames).Buf.Size = 0;
    p->IsInitializing = false;
    p->IsLayoutLocked = false;
    p->InnerWidth = fVar35;
    (p->OuterRect).Min = local_50.Min;
    (p->OuterRect).Max = local_50.Max;
    (p->WorkRect).Min = local_50.Min;
    (p->WorkRect).Max = local_50.Max;
    if ((flags & 0x300000U) != 0) {
      fVar31 = fVar35;
      if ((uVar8 & 0x100000) == 0) {
        fVar31 = 3.4028235e+38;
      }
      fVar35 = (float)(~-(uint)(0.0 < fVar35) & 0x7f7fffff | (uint)fVar31 & -(uint)(0.0 < fVar35));
      if (fVar35 != 3.4028235e+38 || (uVar8 & 0x300000) == 0x100000) {
        if ((uVar8 & 0x300000) == 0x100000) {
          local_98.y = 1.1754944e-38;
        }
        else {
          local_98.y = 0.0;
        }
        local_98.x = (float)(-(uint)(fVar35 != 3.4028235e+38) & (uint)fVar35);
        SetNextWindowContentSize(&local_98);
      }
      IVar30 = (p->OuterRect).Min;
      IVar32 = (p->OuterRect).Max;
      local_98.x = IVar32.x - IVar30.x;
      local_98.y = IVar32.y - IVar30.y;
      BeginChildEx(local_40,uVar23 + id,&local_98,false,(uVar8 & 0x100000) >> 9);
      pIVar4 = pIVar9->CurrentWindow;
      p->InnerWindow = pIVar4;
      IVar30 = (pIVar4->WorkRect).Max;
      (p->WorkRect).Min = (pIVar4->WorkRect).Min;
      (p->WorkRect).Max = IVar30;
      IVar30 = pIVar4->Pos;
      IVar32.x = (pIVar4->Size).x + IVar30.x;
      IVar32.y = (pIVar4->Size).y + IVar30.y;
      (p->OuterRect).Min = IVar30;
      (p->OuterRect).Max = IVar32;
    }
    PushOverrideID(uVar23 + id);
    pIVar4 = p->InnerWindow;
    p->HostIndentX = (pIVar4->DC).Indent.x;
    IVar30 = (pIVar4->ClipRect).Max;
    (p->HostClipRect).Min = (pIVar4->ClipRect).Min;
    (p->HostClipRect).Max = IVar30;
    p->HostSkipItems = pIVar4->SkipItems;
    IVar30 = (pIVar4->WorkRect).Max;
    (p->HostWorkRect).Min = (pIVar4->WorkRect).Min;
    (p->HostWorkRect).Max = IVar30;
    p->HostCursorMaxPos = (pIVar4->DC).CursorMaxPos;
    if ((uVar8 >> 10 & 1) == 0) {
      p->CellPaddingX1 = 0.0;
      p->CellPaddingX2 = 0.0;
      p->CellPaddingY = (pIVar9->Style).CellPadding.y;
      fVar35 = (pIVar9->Style).CellPadding.x;
    }
    else {
      IVar30 = (pIVar9->Style).CellPadding;
      p->CellPaddingX1 = IVar30.x + 1.0;
      p->CellPaddingX2 = IVar30.x;
      p->CellPaddingY = IVar30.y;
      fVar35 = 0.0;
    }
    p->CellSpacingX = fVar35;
    p->CurrentColumn = -1;
    p->CurrentRow = -1;
    p->RowBgColorCounter = 0;
    *(uint *)&p->field_0x94 = (uint)*(ushort *)&p->field_0x94;
    pIVar18 = &pIVar4->ClipRect;
    if (pIVar4 == pIVar3) {
      pIVar18 = &p->WorkRect;
    }
    IVar30 = pIVar18->Max;
    (p->InnerClipRect).Min = pIVar18->Min;
    (p->InnerClipRect).Max = IVar30;
    IVar30 = (p->InnerClipRect).Min;
    auVar33._8_8_ = 0;
    auVar33._0_4_ = (p->InnerClipRect).Max.x;
    auVar33._4_4_ = (p->InnerClipRect).Max.y;
    IVar32 = (p->WorkRect).Min;
    fVar36 = IVar32.x;
    fVar37 = IVar32.y;
    auVar7._8_8_ = 0;
    auVar7._0_4_ = (p->WorkRect).Max.x;
    auVar7._4_4_ = (p->WorkRect).Max.y;
    auVar34 = minps(auVar33,auVar7);
    IVar32 = (p->HostClipRect).Min;
    fVar38 = IVar32.x;
    fVar39 = IVar32.y;
    auVar40._8_8_ = 0;
    auVar40._0_4_ = (p->HostClipRect).Max.x;
    auVar40._4_4_ = (p->HostClipRect).Max.y;
    auVar34 = minps(auVar34,auVar40);
    fVar35 = IVar30.x;
    fVar31 = IVar30.y;
    uVar29 = -(uint)(fVar36 <= fVar35);
    uVar23 = -(uint)(fVar37 <= fVar31);
    uVar22 = CONCAT44(~uVar23 & (uint)fVar37,~uVar29 & (uint)fVar36) |
             CONCAT44((uint)fVar31 & uVar23,(uint)fVar35 & uVar29);
    fVar35 = (float)uVar22;
    fVar31 = (float)(uVar22 >> 0x20);
    uVar29 = -(uint)(fVar38 <= fVar35);
    uVar23 = -(uint)(fVar39 <= fVar31);
    (p->InnerClipRect).Min =
         (ImVec2)(CONCAT44(~uVar23 & (uint)fVar39,~uVar29 & (uint)fVar38) |
                 CONCAT44((uint)fVar31 & uVar23,(uint)fVar35 & uVar29));
    (p->InnerClipRect).Max = auVar34._0_8_;
    pIVar18 = &pIVar4->ClipRect;
    if ((uVar8 >> 0x12 & 1) != 0) {
      pIVar18 = &p->WorkRect;
    }
    (p->InnerClipRect).Max.y = (pIVar18->Max).y;
    IVar30 = (p->InnerClipRect).Max;
    (p->BackgroundClipRect).Min = (p->InnerClipRect).Min;
    (p->BackgroundClipRect).Max = IVar30;
    fVar35 = (p->WorkRect).Min.y;
    p->RowPosY2 = fVar35;
    p->RowPosY1 = fVar35;
    p->RowTextBaseline = 0.0;
    bVar14 = (byte)(uVar8 >> 0x16) & 3;
    p->FreezeRowsRequest = bVar14;
    pfVar1 = &(pIVar4->Scroll).y;
    bVar19 = 0;
    if (*pfVar1 != 0.0) {
      bVar19 = bVar14;
    }
    if (NAN(*pfVar1)) {
      bVar19 = bVar14;
    }
    p->FreezeRowsCount = bVar19;
    bVar15 = (byte)(uVar8 >> 0x18) & 3;
    p->FreezeColumnsRequest = bVar15;
    local_68._0_8_ = pIVar4;
    bVar14 = 0;
    if ((pIVar4->Scroll).x != 0.0) {
      bVar14 = bVar15;
    }
    if (NAN((pIVar4->Scroll).x)) {
      bVar14 = bVar15;
    }
    p->FreezeColumnsCount = bVar14;
    p->IsFreezeRowsPassed = bVar19 == 0;
    p->DeclColumnsCount = '\0';
    p->RightMostVisibleColumn = -1;
    IVar11 = GetColorU32(0x2b,1.0);
    p->BorderColorStrong = IVar11;
    IVar11 = GetColorU32(0x2c,1.0);
    p->BorderColorLight = IVar11;
    fVar35 = (p->InnerClipRect).Max.x;
    p->BorderX1 = (p->InnerClipRect).Min.x;
    p->BorderX2 = fVar35;
    IVar12 = ImPool<ImGuiTable>::GetIndex(local_38,p);
    iVar24 = (pIVar9->CurrentTableStack).Size;
    iVar27 = (pIVar9->CurrentTableStack).Capacity;
    if (iVar24 == iVar27) {
      iVar24 = iVar24 + 1;
      if (iVar27 == 0) {
        iVar17 = 8;
      }
      else {
        iVar17 = iVar27 / 2 + iVar27;
      }
      if (iVar24 < iVar17) {
        iVar24 = iVar17;
      }
      if (iVar27 < iVar24) {
        __dest = (ImGuiPtrOrIndex *)MemAlloc((long)iVar24 << 4);
        pIVar5 = (pIVar9->CurrentTableStack).Data;
        if (pIVar5 != (ImGuiPtrOrIndex *)0x0) {
          memcpy(__dest,pIVar5,(long)(pIVar9->CurrentTableStack).Size << 4);
          MemFree((pIVar9->CurrentTableStack).Data);
        }
        (pIVar9->CurrentTableStack).Data = __dest;
        (pIVar9->CurrentTableStack).Capacity = iVar24;
      }
    }
    pIVar5 = (pIVar9->CurrentTableStack).Data;
    iVar24 = (pIVar9->CurrentTableStack).Size;
    pIVar5[iVar24].Ptr = (void *)0x0;
    pIVar5[iVar24].Index = IVar12;
    (pIVar9->CurrentTableStack).Size = (pIVar9->CurrentTableStack).Size + 1;
    pIVar9->CurrentTable = p;
    (pIVar3->DC).CurrentTable = p;
    if (((local_6c & 2) != 0) && ((uVar8 & 2) == 0)) {
      p->IsResetDisplayOrderRequest = true;
    }
    iVar24 = (int)((ulong)((long)(p->Columns).DataEnd - (long)(p->Columns).Data) >> 3) * -0x3b13b13b
    ;
    if (iVar24 != columns_count && iVar24 != 0) {
      iVar24 = (p->RawData).Capacity;
      if (iVar24 < 0) {
        uVar23 = iVar24 / 2 + iVar24;
        uVar29 = 0;
        if (0 < (int)uVar23) {
          uVar29 = uVar23;
        }
        pcVar13 = (char *)MemAlloc((ulong)uVar29);
        pcVar21 = (p->RawData).Data;
        if (pcVar21 != (char *)0x0) {
          memcpy(pcVar13,pcVar21,(long)(p->RawData).Size);
          MemFree((p->RawData).Data);
        }
        (p->RawData).Data = pcVar13;
        (p->RawData).Capacity = uVar29;
      }
      (p->RawData).Size = 0;
    }
    if ((p->RawData).Size == 0) {
      local_88 = 0;
      local_88._0_4_ = 0;
      local_88._4_4_ = columns_count * 0x68;
      uStack_80 = 0;
      local_98.x = 0.0;
      local_98.y = 0.0;
      uStack_80._0_4_ = columns_count * 0x69;
      lVar28 = (long)(columns_count * 8) + (long)(columns_count * 0x69);
      iVar27 = (int)lVar28;
      _iStack_90 = CONCAT44(3,iVar27);
      iVar24 = (p->RawData).Capacity;
      if (iVar24 < iVar27) {
        if (iVar24 == 0) {
          iVar17 = 8;
        }
        else {
          iVar17 = iVar24 / 2 + iVar24;
        }
        if (iVar17 <= iVar27) {
          iVar17 = iVar27;
        }
        if (iVar24 < iVar17) {
          pcVar13 = (char *)MemAlloc((long)iVar17);
          pcVar21 = (p->RawData).Data;
          if (pcVar21 != (char *)0x0) {
            memcpy(pcVar13,pcVar21,(long)(p->RawData).Size);
            MemFree((p->RawData).Data);
          }
          (p->RawData).Data = pcVar13;
          (p->RawData).Capacity = iVar17;
        }
      }
      (p->RawData).Size = iVar27;
      IVar30 = (ImVec2)(p->RawData).Data;
      iVar24 = iStack_8c;
      local_98 = IVar30;
      if (iStack_8c != 3) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                    ,0x214,"GetSpanPtrBegin","ImGui ASSERT FAILED: %s",
                    "n >= 0 && n < CHUNKS && CurrSpan == CHUNKS");
      }
      lVar20 = (long)(int)local_88;
      if (iVar24 != 3) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                    ,0x215,"GetSpanPtrEnd","ImGui ASSERT FAILED: %s",
                    "n >= 0 && n < CHUNKS && CurrSpan == CHUNKS");
      }
      lVar25 = (long)local_88._4_4_;
      (p->Columns).Data = (ImGuiTableColumn *)(lVar20 + (long)IVar30);
      (p->Columns).DataEnd = (ImGuiTableColumn *)(lVar25 + (long)IVar30);
      if (iVar24 != 3) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                    ,0x214,"GetSpanPtrBegin","ImGui ASSERT FAILED: %s",
                    "n >= 0 && n < CHUNKS && CurrSpan == CHUNKS");
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                    ,0x215,"GetSpanPtrEnd","ImGui ASSERT FAILED: %s",
                    "n >= 0 && n < CHUNKS && CurrSpan == CHUNKS");
      }
      lVar20 = (long)(int)uStack_80;
      (p->DisplayOrderToIndex).Data = (char *)(lVar25 + (long)IVar30);
      (p->DisplayOrderToIndex).DataEnd = (char *)(lVar20 + (long)IVar30);
      if (iVar24 != 3) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                    ,0x214,"GetSpanPtrBegin","ImGui ASSERT FAILED: %s",
                    "n >= 0 && n < CHUNKS && CurrSpan == CHUNKS");
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                    ,0x215,"GetSpanPtrEnd","ImGui ASSERT FAILED: %s",
                    "n >= 0 && n < CHUNKS && CurrSpan == CHUNKS");
      }
      (p->RowCellData).Data = (ImGuiTableCellData *)(lVar20 + (long)IVar30);
      (p->RowCellData).DataEnd = (ImGuiTableCellData *)((long)IVar30 + lVar28);
      if (0 < columns_count) {
        lVar28 = 0x5a;
        uVar22 = 0;
        do {
          local_78 = 0;
          uStack_72 = 0xffff;
          uStack_70 = 0xff;
          uStack_76 = 0xffffffff;
          pIVar6 = (p->Columns).Data;
          pIVar26 = (ImGuiTableColumn *)((long)pIVar6 + lVar28 + -0x5a);
          if ((p->Columns).DataEnd <= pIVar26) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                        ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
          }
          *(undefined8 *)((long)pIVar6 + lVar28 + -0x4a) = 0;
          *(undefined8 *)((long)pIVar6 + lVar28 + -0x42) = 0;
          (pIVar26->ClipRect).Min.x = 0.0;
          (pIVar26->ClipRect).Min.y = 0.0;
          *(undefined8 *)((long)pIVar6 + lVar28 + -0x52) = 0;
          *(undefined8 *)((long)pIVar6 + lVar28 + -0x3a) = 0;
          *(undefined8 *)((long)pIVar6 + lVar28 + -0x32) = 0xbf800000bf800000;
          *(undefined4 *)((long)pIVar6 + lVar28 + -0x2a) = 0xbf800000;
          puVar2 = (undefined8 *)((long)pIVar6 + lVar28 + -0x26);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)pIVar6 + lVar28 + -0x16);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined4 *)((long)pIVar6 + lVar28 + -6) = 0x101ffff;
          *(ulong *)((long)pIVar6 + lVar28 + -2) = CONCAT26(uStack_72,CONCAT42(uStack_76,local_78));
          *(undefined1 *)((long)&(pIVar6->ClipRect).Min.y + lVar28 + 2) = uStack_70;
          *(undefined4 *)((long)&(pIVar6->ClipRect).Min.y + lVar28 + 3) = 0xff0707;
          pcVar21 = (p->DisplayOrderToIndex).Data + uVar22;
          if ((p->DisplayOrderToIndex).DataEnd <= pcVar21) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                        ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
          }
          *pcVar21 = (char)uVar22;
          pIVar6 = (p->Columns).Data;
          if ((p->Columns).DataEnd <= (ImGuiTableColumn *)((long)pIVar6 + lVar28 + -0x5a)) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                        ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
          }
          *(char *)((long)&(pIVar6->ClipRect).Min.x + lVar28) = (char)uVar22;
          uVar22 = uVar22 + 1;
          lVar28 = lVar28 + 0x68;
        } while ((uint)columns_count != uVar22);
      }
      p->IsSettingsRequestLoad = true;
      p->IsInitializing = true;
      p->IsSortSpecsDirty = true;
    }
    if (p->IsSettingsRequestLoad == true) {
      TableLoadSettings(p);
    }
    fVar35 = pIVar9->FontSize;
    fVar31 = p->RefScale;
    if ((fVar31 != 0.0) || (NAN(fVar31))) {
      if (((fVar31 != fVar35) || (NAN(fVar31) || NAN(fVar35))) && (0 < columns_count)) {
        lVar28 = 0;
        do {
          pIVar6 = (p->Columns).Data;
          if ((p->Columns).DataEnd <= (ImGuiTableColumn *)((long)&(pIVar6->ClipRect).Min.x + lVar28)
             ) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                        ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
          }
          fVar36 = *(float *)((long)&pIVar6->WidthRequest + lVar28);
          pIVar6 = (p->Columns).Data;
          if ((p->Columns).DataEnd <= (ImGuiTableColumn *)((long)&(pIVar6->ClipRect).Min.x + lVar28)
             ) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                        ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
          }
          *(float *)((long)&pIVar6->WidthRequest + lVar28) = fVar36 * (fVar35 / fVar31);
          lVar28 = lVar28 + 0x68;
        } while ((ulong)(uint)columns_count * 0x68 - lVar28 != 0);
      }
    }
    p->RefScale = fVar35;
    *(undefined1 *)(local_68._0_8_ + 0x83) = 1;
    TableBeginUpdateColumns(p);
    bVar10 = true;
  }
  else {
LAB_001ee614:
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    flags = TableFixFlags(flags);
    if (outer_window->Flags & ImGuiWindowFlags_NoSavedSettings)
        flags |= ImGuiTableFlags_NoSavedSettings;

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const ImGuiTableFlags table_last_flags = table->Flags;
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->ColumnsNames.Buf.resize(0);
    table->IsInitializing = false;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    table->OuterRect = outer_rect;
    table->WorkRect = outer_rect;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Create scrolling region (without border = zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, table->OuterRect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
    }

    // Push a standardized ID for both child and not-child using tables, equivalent to BeginTable() doing PushID(label) matching
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    table->HostWorkRect = inner_window->WorkRect;
    table->HostCursorMaxPos = inner_window->DC.CursorMaxPos;

    // Borders
    // - None               ........Content..... Pad .....Content........
    // - OuterV             | Pad ..Content..... Pad .....Content.. Pad |       // FIXME-TABLE: Not handled properly
    // - InnerV             ........Content.. Pad | Pad ..Content........       // FIXME-TABLE: Not handled properly
    // - OuterV+InnerV      | Pad ..Content.. Pad | Pad ..Content.. Pad |

    const bool has_cell_padding_x = (flags & ImGuiTableFlags_BordersOuterV) != 0;
    table->CellPaddingX1 = has_cell_padding_x ? g.Style.CellPadding.x + 1.0f : 0.0f;
    table->CellPaddingX2 = has_cell_padding_x ? g.Style.CellPadding.x : 0.0f;
    table->CellPaddingY = g.Style.CellPadding.y;
    table->CellSpacingX = has_cell_padding_x ? 0.0f : g.Style.CellPadding.x;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWith(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? table->WorkRect.Max.y : inner_window->ClipRect.Max.y;
    table->BackgroundClipRect = table->InnerClipRect;
    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = (ImS8)((flags & ImGuiTableFlags_ScrollFreezeRowsMask_) >> ImGuiTableFlags_ScrollFreezeRowsShift_);
    table->FreezeRowsCount = (inner_window->Scroll.y != 0.0f) ? table->FreezeRowsRequest : 0;
    table->FreezeColumnsRequest = (ImS8)((flags & ImGuiTableFlags_ScrollFreezeColumnsMask_) >> ImGuiTableFlags_ScrollFreezeColumnsShift_);
    table->FreezeColumnsCount = (inner_window->Scroll.x != 0.0f) ? table->FreezeColumnsRequest : 0;
    table->IsFreezeRowsPassed = (table->FreezeRowsCount == 0);
    table->DeclColumnsCount = 0;
    table->RightMostVisibleColumn = -1;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // Make table current
    g.CurrentTableStack.push_back(ImGuiPtrOrIndex(g.Tables.GetIndex(table)));
    g.CurrentTable = table;
    outer_window->DC.CurrentTable = table;
    if ((table_last_flags & ImGuiTableFlags_Reorderable) && !(flags & ImGuiTableFlags_Reorderable))
        table->IsResetDisplayOrderRequest = true;

    // Setup default columns state. Clear data if columns count changed
    const int stored_size = table->Columns.size();
    if (stored_size != 0 && stored_size != columns_count)
        table->RawData.resize(0);
    if (table->RawData.Size == 0)
    {
        // Allocate single buffer for our arrays
        ImSpanAllocator<3> span_allocator;
        span_allocator.ReserveBytes(0, columns_count * sizeof(ImGuiTableColumn));
        span_allocator.ReserveBytes(1, columns_count * sizeof(ImS8));
        span_allocator.ReserveBytes(2, columns_count * sizeof(ImGuiTableCellData));
        table->RawData.resize(span_allocator.GetArenaSizeInBytes());
        span_allocator.SetArenaBasePtr(table->RawData.Data);
        span_allocator.GetSpan(0, &table->Columns);
        span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
        span_allocator.GetSpan(2, &table->RowCellData);

        for (int n = 0; n < columns_count; n++)
        {
            table->Columns[n] = ImGuiTableColumn();
            table->Columns[n].DisplayOrder = table->DisplayOrderToIndex[n] = (ImS8)n;
        }
        table->IsInitializing = table->IsSettingsRequestLoad = table->IsSortSpecsDirty = true;
    }

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextCell() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Update/lock which columns will be Visible for the frame
    TableBeginUpdateColumns(table);

    return true;
}